

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qapplication.cpp
# Opt level: O2

void __thiscall QApplicationPrivate::notifyDragStarted(QApplicationPrivate *this,QDrag *drag)

{
  long lVar1;
  
  QGuiApplicationPrivate::notifyDragStarted((QDrag *)this);
  if (qt_button_down != (QWidget *)0x0) {
    lVar1 = (**(code **)(*(long *)qt_button_down + 8))(qt_button_down,"QQuickWidget");
    if (lVar1 == 0) {
      qt_button_down = (QWidget *)0x0;
    }
  }
  return;
}

Assistant:

void QApplicationPrivate::notifyDragStarted(const QDrag *drag)
{
    QGuiApplicationPrivate::notifyDragStarted(drag);
    // QTBUG-26145
    // Prevent pickMouseReceiver() from using the widget where the drag was started after a drag operation...
    // QTBUG-56713
    // ...only if qt_button_down is not a QQuickWidget
    if (qt_button_down && !qt_button_down->inherits("QQuickWidget"))
        qt_button_down = nullptr;
}